

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getColMinAbsUnscaled
          (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,int i)

{
  type_conflict5 tVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int in_ECX;
  int __c;
  long in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  abs;
  int j;
  int exp2;
  int exp1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *colVec;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *min;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe60;
  cpp_dec_float<50U,_int,_void> *this_00;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  uint uVar5;
  cpp_dec_float<50U,_int,_void> *a;
  undefined1 local_17c [24];
  int in_stack_fffffffffffffe9c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffea0;
  undefined1 local_10c [56];
  undefined1 local_d4 [56];
  uint local_9c;
  int local_98;
  int local_94;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  cpp_dec_float<50U,_int,_void> *local_88;
  DataArray<int> *local_80;
  int local_74;
  undefined8 local_58;
  undefined8 local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_80 = *(DataArray<int> **)(in_RSI + 0x10);
  local_88 = *(cpp_dec_float<50U,_int,_void> **)(in_RSI + 0x18);
  a = in_RDI;
  local_74 = in_ECX;
  local_90 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::colVector(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  local_50 = infinity();
  local_58 = 0;
  local_20 = local_50;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_RDI,(double)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  piVar3 = DataArray<int>::operator[](local_80,local_74);
  local_98 = *piVar3;
  local_9c = 0;
  while (uVar5 = local_9c,
        iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_90), (int)uVar5 < iVar2) {
    this_00 = local_88;
    pcVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index(local_90,(char *)(ulong)local_9c,__c);
    piVar3 = DataArray<int>::operator[]((DataArray<int> *)this_00,(int)pcVar4);
    local_94 = *piVar3;
    local_40 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_90,local_9c);
    local_38 = local_17c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (this_00,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)a);
    local_10 = local_d4;
    local_18 = local_10c;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (this_00,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3eb6c3);
    if (tVar1) {
      local_30 = local_d4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (this_00,(cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    local_9c = local_9c + 1;
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R SPxScaler<R>::getColMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nCols());
   assert(i >= 0);

   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& colVec = lp.LPColSetBase<R>::colVector(i);

   R min = R(infinity);
   int exp1;
   int exp2 = colscaleExp[i];

   for(int j = 0; j < colVec.size(); j++)
   {
      exp1 = rowscaleExp[colVec.index(j)];
      R abs = spxAbs(spxLdexp(colVec.value(j), -exp1 - exp2));

      if(abs < min)
         min = abs;
   }

   return min;
}